

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp_math.c
# Opt level: O3

int mp_mulmod(mp_int *a,mp_int *b,mp_int *c,mp_int *d)

{
  int iVar1;
  mp_int local_38;
  
  local_38.dp = (mp_digit *)calloc(1,0x100);
  if (local_38.dp == (mp_digit *)0x0) {
    iVar1 = -2;
  }
  else {
    local_38.used = 0;
    local_38.alloc = 0x20;
    local_38.sign = 0;
    iVar1 = mp_mul(a,b,&local_38);
    if (iVar1 == 0) {
      iVar1 = mp_mod(&local_38,c,d);
    }
    if (local_38.dp != (mp_digit *)0x0) {
      free(local_38.dp);
    }
  }
  return iVar1;
}

Assistant:

int mp_mulmod (mp_int * a, mp_int * b, mp_int * c, mp_int * d)
{
  int     res;
  mp_int  t;

  if ((res = mp_init (&t)) != MP_OKAY) {
    return res;
  }

  if ((res = mp_mul (a, b, &t)) != MP_OKAY) {
    mp_clear (&t);
    return res;
  }

  res = mp_mod (&t, c, d);
  mp_clear (&t);

  return res;
}